

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commitrange.h
# Opt level: O0

void __thiscall
snmalloc::CommitRange<snmalloc::PALLinux>::
Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>
::dealloc_range(Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>
                *this,CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                      base,size_t size)

{
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  in_RDX;
  Type<snmalloc::LockRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>
  *in_RSI;
  void *in_RDI;
  size_t in_stack_ffffffffffffffc8;
  Type<snmalloc::LockRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>
  *local_10;
  Type<snmalloc::LockRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>
  **local_8;
  
  local_8 = &local_10;
  local_10 = in_RSI;
  PALLinux::notify_not_using(in_RDI,in_stack_ffffffffffffffc8);
  StaticRange::
  Type<snmalloc::LockRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>
  ::dealloc_range(local_10,in_RDX,(size_t)in_RDI);
  return;
}

Assistant:

void dealloc_range(CapPtr<void, ChunkBounds> base, size_t size)
      {
        SNMALLOC_ASSERT_MSG(
          (size % PAL::page_size) == 0,
          "size ({}) must be a multiple of page size ({})",
          size,
          PAL::page_size);
        PAL::notify_not_using(base.unsafe_ptr(), size);
        parent.dealloc_range(base, size);
      }